

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_UndefinedFieldType_Test::TestBody
          (ValidationErrorTest_UndefinedFieldType_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60
  ;
  allocator<char> local_31;
  string local_30;
  ValidationErrorTest_UndefinedFieldType_Test *local_10;
  ValidationErrorTest_UndefinedFieldType_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "name: \"foo.proto\" message_type {  name: \"Foo\"  field { name:\"foo\" number:1 label:LABEL_OPTIONAL type_name:\"Bar\" }}"
             ,&local_31);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_60,"foo.proto: Foo.foo: TYPE: \"Bar\" is not defined.\n");
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_30,&local_60);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, UndefinedFieldType) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  field { name:\"foo\" number:1 label:LABEL_OPTIONAL type_name:\"Bar\" }"
      "}",

      "foo.proto: Foo.foo: TYPE: \"Bar\" is not defined.\n");
}